

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O0

void __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::insert
          (ClassArray<soplex::Nonzero<double>_> *this,int i,int n)

{
  Nonzero<double> *pNVar1;
  Nonzero<double> *pNVar2;
  int in_EDX;
  int in_ESI;
  ClassArray<soplex::Nonzero<double>_> *in_RDI;
  int j;
  int in_stack_ffffffffffffffdc;
  int local_14;
  
  if (0 < in_EDX) {
    local_14 = in_RDI->thesize;
    reSize(in_RDI,in_stack_ffffffffffffffdc);
    while (in_ESI < local_14) {
      local_14 = local_14 + -1;
      pNVar1 = in_RDI->data;
      pNVar2 = in_RDI->data;
      pNVar2[local_14 + in_EDX].val = pNVar1[local_14].val;
      pNVar2[local_14 + in_EDX].idx = pNVar1[local_14].idx;
    }
  }
  return;
}

Assistant:

void insert(int i, int n)
   {
      assert(n >= 0);
      assert(i >= 0);
      assert(i <= thesize);

      if(n > 0)
      {
         int j = thesize;

         reSize(thesize + n);
         assert(thesize == j + n);

         /// move \p n elements in memory from insert position \p i to the back
         while(j > i)
         {
            j--;
            data[j + n] = data[j];
         }
      }
   }